

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  short sVar5;
  int iVar6;
  size_t err_code;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  XXH64_hash_t XVar10;
  uint uVar11;
  code *pcVar12;
  long lVar13;
  code *pcVar14;
  code *pcVar15;
  size_t err_code_3;
  ulong uVar16;
  BYTE *op;
  ulong local_c0;
  code *local_b0;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar7 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  sVar7 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
  if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
    XXH64_update(&cctx->xxhState,src,srcSize);
  }
  op = (BYTE *)((long)dst + sVar7);
  uVar16 = dstCapacity - sVar7;
  local_48 = 0;
  uStack_40 = 0;
  ZVar2 = (cctx->appliedParams).blockDelimiters;
  pcVar15 = (code *)0x0;
  pcVar14 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  if (ZVar2 != ZSTD_sf_noBlockDelimiters) {
    pcVar14 = pcVar15;
  }
  pcVar12 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  if (ZVar2 != ZSTD_sf_explicitBlockDelimiters) {
    pcVar12 = pcVar14;
  }
  local_c0 = uVar16;
  if (srcSize == 0) {
    if (uVar16 < 4) {
      pcVar15 = (code *)0x0;
    }
    else {
      op[0] = '\x01';
      op[1] = '\0';
      op[2] = '\0';
      op[3] = '\0';
      op = op + 3;
      pcVar15 = (code *)0x3;
      local_c0 = uVar16 - 3;
    }
    local_b0 = (code *)0xffffffffffffffba;
    if (uVar16 < 4) goto LAB_006a2bcb;
  }
  local_b0 = pcVar15;
  if (srcSize == 0) {
LAB_006a2bcb:
    pcVar14 = local_b0;
    if ((local_b0 < (code *)0xffffffffffffff89) &&
       (pcVar15 = local_b0 + sVar7, pcVar14 = pcVar15,
       (cctx->appliedParams).fParams.checksumFlag != 0)) {
      XVar10 = XXH64_digest(&cctx->xxhState);
      pcVar14 = (code *)0xffffffffffffffba;
      if (3 < uVar16 - (long)local_b0) {
        *(int *)((long)dst + (long)pcVar15) = (int)XVar10;
        pcVar14 = pcVar15 + 4;
      }
    }
    return (size_t)pcVar14;
  }
  uVar16 = cctx->blockSize;
  uVar11 = (uint)uVar16;
  if (srcSize < uVar16) {
    uVar11 = (uint)srcSize;
  }
  (cctx->seqStore).lit = (cctx->seqStore).litStart;
  (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
  (cctx->seqStore).longLengthType = ZSTD_llt_none;
  iVar6 = 0x6a28c1;
  uVar8 = (*pcVar12)(cctx,&local_48,inSeqs,inSeqsSize,src,(ulong)uVar11);
  lVar13 = 1;
  if (0xffffffffffffff88 < uVar8) goto LAB_006a2ab2;
  uVar8 = uVar11 - uVar8;
  sVar5 = (short)uVar8;
  if (uVar8 < 7) {
    uVar9 = 0xffffffffffffffba;
    if (uVar8 + 3 <= local_c0) {
      *(ushort *)op = (ushort)(srcSize <= uVar16) + sVar5 * 8;
      op[2] = '\0';
      memcpy(op + 3,src,uVar8);
      uVar9 = uVar8 + 3;
    }
    lVar13 = 1;
    if (uVar9 < 0xffffffffffffff89) {
      sVar7 = (*(code *)&LAB_006a2ac4)();
      return sVar7;
    }
    goto LAB_006a2ab2;
  }
  sVar7 = ZSTD_entropyCompressSeqStore
                    (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                     &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,op + 3,
                     local_c0 - 3,uVar8,cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,iVar6);
  if (sVar7 < 0xffffffffffffff89) {
    if ((((cctx->isFirstBlock == 0) &&
         ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) < 0x20))
        && ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) &&
       (iVar6 = ZSTD_isRLE((BYTE *)src,srcSize), iVar6 != 0)) {
      sVar7 = 1;
    }
    if (sVar7 == 1) {
      if (local_c0 < 4) goto LAB_006a2aa8;
      BVar1 = *src;
      *(ushort *)op = (srcSize <= uVar16) + 2 + sVar5 * 8;
      op[2] = (BYTE)(uVar8 >> 0xd);
      op[3] = BVar1;
    }
    else if (sVar7 == 0) {
      uVar9 = 0xffffffffffffffba;
      if (uVar8 + 3 <= local_c0) {
        *(ushort *)op = (ushort)(srcSize <= uVar16) + sVar5 * 8;
        op[2] = (BYTE)(uVar8 >> 0xd);
        memcpy(op + 3,src,uVar8);
        uVar9 = uVar8 + 3;
      }
      if (0xffffffffffffff88 < uVar9) goto LAB_006a2aa8;
    }
    else {
      pZVar3 = (cctx->blockState).prevCBlock;
      pZVar4 = (cctx->blockState).nextCBlock;
      (cctx->blockState).prevCBlock = pZVar4;
      (cctx->blockState).nextCBlock = pZVar3;
      if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      *(ushort *)op = (srcSize <= uVar16) + 4 + (short)sVar7 * 8;
      op[2] = (BYTE)(sVar7 >> 0xd);
    }
    if (uVar16 < srcSize) {
      cctx->isFirstBlock = 0;
      lVar13 = 0;
    }
    else {
      lVar13 = 3;
    }
  }
  else {
LAB_006a2aa8:
    lVar13 = 1;
  }
LAB_006a2ab2:
  sVar7 = (*(code *)((long)&DAT_007e6de8 + (long)(int)(&DAT_007e6de8)[lVar13]))();
  return sVar7;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* const cctx, void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize) {
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(3, "ZSTD_compressSequences()");
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(3, "Final compressed size: %zu", cSize);
    return cSize;
}